

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

uint32_t OPENSSL_hash32(void *ptr,size_t len)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = 0x811c9dc5;
  if (len != 0) {
    sVar2 = 0;
    do {
      uVar1 = (*(byte *)((long)ptr + sVar2) ^ uVar1) * 0x1000193;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  return uVar1;
}

Assistant:

uint32_t OPENSSL_hash32(const void *ptr, size_t len) {
  // These are the FNV-1a parameters for 32 bits.
  static const uint32_t kPrime = 16777619u;
  static const uint32_t kOffsetBasis = 2166136261u;

  const uint8_t *in = reinterpret_cast<const uint8_t *>(ptr);
  uint32_t h = kOffsetBasis;

  for (size_t i = 0; i < len; i++) {
    h ^= in[i];
    h *= kPrime;
  }

  return h;
}